

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_proxy_revocable(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue JVar1;
  int iVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  JSContext *in_RSI;
  undefined8 in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  JSValue obj;
  JSValue revoke_obj;
  JSValue proxy_obj;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  JSContext *in_stack_ffffffffffffff50;
  JSValueUnion ctx_00;
  JSValue in_stack_ffffffffffffff58;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_78;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  int32_t iVar5;
  undefined4 in_stack_fffffffffffffff4;
  undefined8 local_8;
  
  JVar3.tag._0_4_ = in_stack_fffffffffffffff0;
  JVar3.u = (JSValueUnion)in_RDX;
  JVar3.tag._4_4_ = in_stack_fffffffffffffff4;
  JVar3 = js_proxy_constructor
                    (in_RSI,JVar3,(int)((ulong)in_RDI >> 0x20),
                     (JSValue *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0));
  local_78 = JVar3.u;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    JVar4.u._4_4_ = in_stack_ffffffffffffff4c;
    JVar4.u.int32 = in_stack_ffffffffffffff48;
    JVar4.tag = (int64_t)in_stack_ffffffffffffff50;
    JVar4 = js_proxy_revoke_constructor((JSContext *)0x17d9bb,JVar4);
    local_98 = JVar4.u;
    local_90 = (JSValueUnion)JVar4.tag;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 == 0) {
      in_stack_ffffffffffffff58 = JS_NewObject((JSContext *)0x17d9ff);
      ctx_00 = in_stack_ffffffffffffff58.u;
      local_8 = (JSValueUnion)in_stack_ffffffffffffff58.tag;
      iVar2 = JS_IsException(in_stack_ffffffffffffff58);
      if (iVar2 == 0) {
        this_obj.tag = (int64_t)local_78;
        this_obj.u.ptr = local_90;
        val.tag = (int64_t)local_98;
        val.u.ptr = local_8;
        JS_DefinePropertyValue
                  ((JSContext *)ctx_00.ptr,this_obj,JVar3.tag._4_4_,val,in_stack_ffffffffffffffd0);
        this_obj_00.tag = (int64_t)local_78;
        this_obj_00.u.ptr = local_90;
        val_00.tag = (int64_t)local_98;
        val_00.u.ptr = local_8;
        JS_DefinePropertyValue
                  ((JSContext *)ctx_00.ptr,this_obj_00,JVar3.tag._4_4_,val_00,
                   in_stack_ffffffffffffffd0);
        iVar5 = ctx_00.int32;
        in_stack_fffffffffffffff4 = ctx_00._4_4_;
        goto LAB_0017daee;
      }
    }
  }
  JS_FreeValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  JS_FreeValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  iVar5 = 0;
  local_8 = 2.96439387504748e-323;
LAB_0017daee:
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = iVar5;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue js_proxy_revocable(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue proxy_obj, revoke_obj = JS_UNDEFINED, obj;

    proxy_obj = js_proxy_constructor(ctx, JS_UNDEFINED, argc, argv);
    if (JS_IsException(proxy_obj))
        goto fail;
    revoke_obj = js_proxy_revoke_constructor(ctx, proxy_obj);
    if (JS_IsException(revoke_obj))
        goto fail;
    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        goto fail;
    // XXX: exceptions?
    JS_DefinePropertyValue(ctx, obj, JS_ATOM_proxy, proxy_obj, JS_PROP_C_W_E);
    JS_DefinePropertyValue(ctx, obj, JS_ATOM_revoke, revoke_obj, JS_PROP_C_W_E);
    return obj;
 fail:
    JS_FreeValue(ctx, proxy_obj);
    JS_FreeValue(ctx, revoke_obj);
    return JS_EXCEPTION;
}